

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall gmlc::networking::TcpConnection::startReceive(TcpConnection *this)

{
  bool bVar1;
  ConnectionStates CVar2;
  element_type *peVar3;
  anon_class_16_1_ba1d6e4e *__f;
  __int_type_conflict3 _Var4;
  size_type sVar5;
  long in_RDI;
  vector<char,_std::allocator<char>_> *this_00;
  ConnectionStates exp;
  undefined8 in_stack_ffffffffffffff68;
  ConnectionStates __i;
  atomic<gmlc::networking::TcpConnection::ConnectionStates> *in_stack_ffffffffffffff70;
  TriggerVariable *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  function<void_(const_std::error_code_&,_unsigned_long)> *this_01;
  ConnectionStates *in_stack_ffffffffffffff88;
  atomic<gmlc::networking::TcpConnection::ConnectionStates> *in_stack_ffffffffffffff90;
  undefined1 local_30 [36];
  int local_c;
  
  __i = (ConnectionStates)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff78);
  if (bVar1) {
    concurrency::TriggerVariable::trigger(in_stack_ffffffffffffff78);
  }
  else {
    CVar2 = std::atomic::operator_cast_to_ConnectionStates
                      ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)0x7bdebf);
    if (CVar2 == PRESTART) {
      concurrency::TriggerVariable::activate(in_stack_ffffffffffffff78);
      concurrency::TriggerVariable::activate(in_stack_ffffffffffffff78);
      std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                (in_stack_ffffffffffffff70,__i);
    }
    local_c = 0;
    bVar1 = std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::compare_exchange_strong
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (ConnectionStates)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (memory_order)in_stack_ffffffffffffff80);
    if (bVar1) {
      bVar1 = concurrency::TriggerVariable::isActive((TriggerVariable *)0x7bdf3b);
      if (!bVar1) {
        concurrency::TriggerVariable::activate(in_stack_ffffffffffffff78);
      }
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffff78);
      if (bVar1) {
        std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::operator=
                  (in_stack_ffffffffffffff70,__i);
        concurrency::TriggerVariable::trigger(in_stack_ffffffffffffff78);
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x7bdf71);
        this_00 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x30);
        __f = (anon_class_16_1_ba1d6e4e *)
              std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0x7bdf88);
        _Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)__f);
        this_01 = (function<void_(const_std::error_code_&,_unsigned_long)> *)
                  ((long)&(__f->ptr).
                          super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + _Var4);
        sVar5 = std::vector<char,_std::allocator<char>_>::size(this_00);
        _Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)__f);
        std::enable_shared_from_this<gmlc::networking::TcpConnection>::shared_from_this
                  ((enable_shared_from_this<gmlc::networking::TcpConnection> *)peVar3);
        std::function<void(std::error_code_const&,unsigned_long)>::
        function<gmlc::networking::TcpConnection::startReceive()::__0,void>(this_01,__f);
        (*peVar3->_vptr_Socket[3])(peVar3,this_01,sVar5 - _Var4,local_30);
        std::function<void_(const_std::error_code_&,_unsigned_long)>::~function
                  ((function<void_(const_std::error_code_&,_unsigned_long)> *)0x7be026);
        startReceive()::$_0::~__0((anon_class_16_1_ba1d6e4e *)0x7be030);
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)__f);
        if (bVar1) {
          peVar3 = std::
                   __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x7be052);
          (*peVar3->_vptr_Socket[0xb])();
        }
      }
    }
    else if (local_c != 1) {
      concurrency::TriggerVariable::trigger(in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void TcpConnection::startReceive()
{
    if (triggerhalt) {
        receivingHalt.trigger();
        return;
    }
    if (state == ConnectionStates::PRESTART) {
        receivingHalt.activate();
        connected.activate();
        state = ConnectionStates::WAITING;
    }
    ConnectionStates exp = ConnectionStates::WAITING;
    if (state.compare_exchange_strong(exp, ConnectionStates::OPERATING)) {
        if (!receivingHalt.isActive()) {
            receivingHalt.activate();
        }
        if (!triggerhalt) {
            socket_->async_read_some(
                data.data() + residBufferSize,
                data.size() - residBufferSize,
                [ptr = shared_from_this()](
                    const std::error_code& err, size_t bytes) {
                    ptr->handle_read(err, bytes);
                });
            if (triggerhalt) {
                // cancel previous operation if triggerhalt is now active
                socket_->cancel();
                // receivingHalt.trigger();
            }
        } else {
            state = ConnectionStates::HALTED;
            receivingHalt.trigger();
        }
    } else if (exp != ConnectionStates::OPERATING) {
        /*either halted or closed*/
        receivingHalt.trigger();
    }
}